

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void google::protobuf::CleanStringLineEndings(string *str,bool auto_end_last_line)

{
  long lVar1;
  long lVar2;
  pointer pcVar3;
  size_type sVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  pcVar3 = (str->_M_dataplus)._M_p;
  sVar4 = str->_M_string_length;
  lVar11 = 0;
  bVar6 = false;
  lVar13 = 0;
  do {
    lVar14 = 0;
    lVar9 = lVar11;
    lVar12 = lVar13;
    while( true ) {
      lVar1 = lVar11 + lVar14;
      lVar2 = lVar13 + lVar14;
      if ((long)sVar4 <= lVar1) {
        if ((bVar6) ||
           (((auto_end_last_line && (0 < lVar2)) && (pcVar3[lVar14 + -1 + lVar13] != '\n')))) {
          std::__cxx11::string::resize((ulong)str);
          (str->_M_dataplus)._M_p[lVar2] = '\n';
        }
        else if (lVar2 < (long)sVar4) {
          std::__cxx11::string::resize((ulong)str);
          return;
        }
        return;
      }
      lVar10 = lVar11;
      lVar7 = lVar13;
      if (((bVar6) || (lVar10 = lVar9, lVar7 = lVar12, (long)sVar4 <= lVar11 + lVar14 + 8)) ||
         (uVar5 = *(ulong *)(pcVar3 + lVar14 + lVar11), lVar10 = lVar1, lVar7 = lVar2,
         (~(0xe0e0e0e0e0e0e0d - uVar5 | uVar5) & 0x8080808080808080) != 0)) break;
      if (lVar2 != lVar1) {
        *(ulong *)(pcVar3 + lVar14 + lVar13) = uVar5;
      }
      lVar12 = lVar12 + 8;
      lVar14 = lVar14 + 8;
      lVar9 = lVar9 + 8;
    }
    lVar13 = lVar7;
    if (pcVar3[lVar10] == '\n') {
      lVar11 = lVar13;
      if (lVar10 != lVar13) {
        pcVar3[lVar13] = '\n';
      }
LAB_002978b3:
      lVar13 = lVar11 + 1;
      bVar8 = false;
    }
    else {
      if (pcVar3[lVar10] != '\r') {
        if (bVar6) {
          pcVar3[lVar13] = '\n';
          lVar13 = lVar13 + 1;
        }
        lVar11 = lVar10;
        if (lVar10 != lVar13) {
          pcVar3[lVar13] = pcVar3[lVar10];
          lVar11 = lVar13;
        }
        goto LAB_002978b3;
      }
      bVar8 = true;
      if (bVar6) {
        pcVar3[lVar13] = '\n';
        lVar13 = lVar13 + 1;
      }
    }
    bVar6 = bVar8;
    lVar11 = lVar10 + 1;
  } while( true );
}

Assistant:

void CleanStringLineEndings(string *str, bool auto_end_last_line) {
  ptrdiff_t output_pos = 0;
  bool r_seen = false;
  ptrdiff_t len = str->size();

  char *p = &(*str)[0];

  for (ptrdiff_t input_pos = 0; input_pos < len;) {
    if (!r_seen && input_pos + 8 < len) {
      uint64_t v = GOOGLE_UNALIGNED_LOAD64(p + input_pos);
      // Loop over groups of 8 bytes at a time until we come across
      // a word that has a byte whose value is less than or equal to
      // '\r' (i.e. could contain a \n (0x0a) or a \r (0x0d) ).
      //
      // We use a has_less macro that quickly tests a whole 64-bit
      // word to see if any of the bytes has a value < N.
      //
      // For more details, see:
      //   http://graphics.stanford.edu/~seander/bithacks.html#HasLessInWord
#define has_less(x, n) (((x) - ~0ULL / 255 * (n)) & ~(x) & ~0ULL / 255 * 128)
      if (!has_less(v, '\r' + 1)) {
#undef has_less
        // No byte in this word has a value that could be a \r or a \n
        if (output_pos != input_pos) {
          GOOGLE_UNALIGNED_STORE64(p + output_pos, v);
        }
        input_pos += 8;
        output_pos += 8;
        continue;
      }
    }
    string::const_reference in = p[input_pos];
    if (in == '\r') {
      if (r_seen) p[output_pos++] = '\n';
      r_seen = true;
    } else if (in == '\n') {
      if (input_pos != output_pos)
        p[output_pos++] = '\n';
      else
        output_pos++;
      r_seen = false;
    } else {
      if (r_seen) p[output_pos++] = '\n';
      r_seen = false;
      if (input_pos != output_pos)
        p[output_pos++] = in;
      else
        output_pos++;
    }
    input_pos++;
  }
  if (r_seen ||
      (auto_end_last_line && output_pos > 0 && p[output_pos - 1] != '\n')) {
    str->resize(output_pos + 1);
    str->operator[](output_pos) = '\n';
  } else if (output_pos < len) {
    str->resize(output_pos);
  }
}